

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O3

void qt_painterpath_isect_curve(QBezier *bezier,QPointF *pt,int *winding,int depth)

{
  uint uVar1;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  QBezier local_c8;
  QBezier local_88;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xffffffff;
  uStack_34 = 0xffffffff;
  uStack_30 = 0xffffffff;
  uStack_2c = 0xffffffff;
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  QBezier::bounds(bezier);
  if (((double)CONCAT44(uStack_3c,uStack_40) <= in_XMM1_Qa) &&
     (in_XMM1_Qa < (double)CONCAT44(uStack_3c,uStack_40) + (double)CONCAT44(uStack_2c,uStack_30))) {
    if (((int)winding == 0x20) ||
       (((double)CONCAT44(uStack_2c,uStack_30) < 0.001 &&
        ((double)CONCAT44(uStack_34,local_38) <= 0.001 &&
         (double)CONCAT44(uStack_34,local_38) != 0.001)))) {
      if (bezier->x1 <= in_XMM0_Qa) {
        *(uint *)&pt->xp =
             *(int *)&pt->xp + (uint)(bezier->y1 <= bezier->y4 && bezier->y4 != bezier->y1) * 2 + -1
        ;
      }
    }
    else {
      local_c8.x1 = bezier->x1;
      local_c8.y1 = bezier->y1;
      local_c8.x2 = (local_c8.x1 + bezier->x2) * 0.5;
      local_c8.y2 = (local_c8.y1 + bezier->y2) * 0.5;
      dVar2 = (bezier->x2 + bezier->x3) * 0.5;
      dVar3 = (bezier->y2 + bezier->y3) * 0.5;
      local_c8.x3 = (local_c8.x2 + dVar2) * 0.5;
      local_c8.y3 = (local_c8.y2 + dVar3) * 0.5;
      local_88.x4 = bezier->x4;
      local_88.y4 = bezier->y4;
      local_88.x3 = (bezier->x3 + local_88.x4) * 0.5;
      local_88.y3 = (bezier->y3 + local_88.y4) * 0.5;
      local_88.x2 = (dVar2 + local_88.x3) * 0.5;
      local_88.y2 = (dVar3 + local_88.y3) * 0.5;
      local_c8.x4 = (local_c8.x3 + local_88.x2) * 0.5;
      local_c8.y4 = (local_c8.y3 + local_88.y2) * 0.5;
      uVar1 = (int)winding + 1;
      local_88.x1 = local_c8.x4;
      local_88.y1 = local_c8.y4;
      qt_painterpath_isect_curve(&local_c8,pt,(int *)(ulong)uVar1,depth);
      qt_painterpath_isect_curve(&local_88,pt,(int *)(ulong)uVar1,depth);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_painterpath_isect_curve(const QBezier &bezier, const QPointF &pt,
                                       int *winding, int depth = 0)
{
    qreal y = pt.y();
    qreal x = pt.x();
    QRectF bounds = bezier.bounds();

    // potential intersection, divide and try again...
    // Please note that a sideeffect of the bottom exclusion is that
    // horizontal lines are dropped, but this is correct according to
    // scan conversion rules.
    if (y >= bounds.y() && y < bounds.y() + bounds.height()) {

        // hit lower limit... This is a rough threshold, but its a
        // tradeoff between speed and precision.
        const qreal lower_bound = qreal(.001);
        if (depth == 32 || (bounds.width() < lower_bound && bounds.height() < lower_bound)) {
            // We make the assumption here that the curve starts to
            // approximate a line after while (i.e. that it doesn't
            // change direction drastically during its slope)
            if (bezier.pt1().x() <= x) {
                (*winding) += (bezier.pt4().y() > bezier.pt1().y() ? 1 : -1);
            }
            return;
        }

        // split curve and try again...
        const auto halves = bezier.split();
        qt_painterpath_isect_curve(halves.first,  pt, winding, depth + 1);
        qt_painterpath_isect_curve(halves.second, pt, winding, depth + 1);
    }
}